

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O0

void __thiscall cmTcpIpConnection::cmTcpIpConnection(cmTcpIpConnection *this,int port)

{
  int port_local;
  cmTcpIpConnection *this_local;
  
  cmEventBasedConnection::cmEventBasedConnection
            (&this->super_cmEventBasedConnection,(cmConnectionBufferStrategy *)0x0);
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_00cc4ef8;
  this->Port = port;
  auto_tcp_t::auto_tcp_t(&this->ServerHandle);
  auto_tcp_t::auto_tcp_t(&this->ClientHandle);
  return;
}

Assistant:

cmTcpIpConnection::cmTcpIpConnection(int port)
  : Port(port)
{
}